

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_cfb.c
# Opt level: O2

void beltCFBStepE(void *buf,size_t count,void *state)

{
  size_t *psVar1;
  octet *block;
  ulong uVar2;
  size_t sVar3;
  
  psVar1 = (size_t *)((long)state + 0x30);
  uVar2 = *(ulong *)((long)state + 0x30);
  if (uVar2 != 0) {
    if (count <= uVar2) {
      memXor2((void *)((long)psVar1 - uVar2),buf,count);
      memCopy(buf,(void *)((long)psVar1 - *psVar1),count);
      sVar3 = *psVar1;
      goto LAB_0012cc72;
    }
    memXor2((void *)((long)psVar1 - uVar2),buf,uVar2);
    memCopy(buf,(void *)((long)psVar1 - *psVar1),*psVar1);
    count = count - *psVar1;
    buf = (void *)((long)buf + *psVar1);
    *psVar1 = 0;
  }
  block = (octet *)((long)state + 0x20);
  for (; 0xf < count; count = count - 0x10) {
    beltBlockEncr(block,(u32 *)state);
    uVar2 = *(ulong *)((long)state + 0x20) ^ *buf;
    *(ulong *)((long)state + 0x20) = uVar2;
    *(ulong *)((long)state + 0x28) = *(ulong *)((long)state + 0x28) ^ *(ulong *)((long)buf + 8);
    *(ulong *)buf = uVar2;
    *(ulong *)((long)buf + 8) = *(ulong *)((long)state + 0x28);
    buf = (void *)((long)buf + 0x10);
  }
  if (count == 0) {
    return;
  }
  beltBlockEncr(block,(u32 *)state);
  memXor2(block,buf,count);
  memCopy(buf,block,count);
  sVar3 = 0x10;
LAB_0012cc72:
  *psVar1 = sVar3 - count;
  return;
}

Assistant:

void beltCFBStepE(void* buf, size_t count, void* state)
{
	belt_cfb_st* st = (belt_cfb_st*)state;
	ASSERT(memIsDisjoint2(buf, count, state, beltCFB_keep()));
	// есть резерв гаммы?
	if (st->reserved)
	{
		if (st->reserved >= count)
		{
			memXor2(st->block + 16 - st->reserved, buf, count);
			memCopy(buf, st->block + 16 - st->reserved, count);
			st->reserved -= count;
			return;
		}
		memXor2(st->block + 16 - st->reserved, buf, st->reserved);
		memCopy(buf, st->block + 16 - st->reserved, st->reserved);
		count -= st->reserved;
		buf = (octet*)buf + st->reserved;
		st->reserved = 0;
	}
	// цикл по полным блокам
	while (count >= 16)
	{
		beltBlockEncr(st->block, st->key);
		beltBlockXor2(st->block, buf);
		beltBlockCopy(buf, st->block);
		buf = (octet*)buf + 16;
		count -= 16;
	}
	// неполный блок?
	if (count)
	{
		beltBlockEncr(st->block, st->key);
		memXor2(st->block, buf, count);
		memCopy(buf, st->block, count);
		st->reserved = 16 - count;
	}
}